

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O3

QUuid createFromName(QUuid ns,QByteArrayView baseData,Algorithm algorithm,int version)

{
  undefined8 uVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QSpan<const_QByteArrayView,_18446744073709551615UL> data;
  QByteArrayView QVar6;
  QUuid QVar7;
  QSpan<std::byte,_18446744073709551615UL> buffer;
  ulong local_58;
  uchar local_50 [8];
  QByteArrayView local_48;
  qsizetype local_38;
  storage_type *local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined4 local_18;
  long local_10;
  
  local_50 = ns.data4;
  local_30 = baseData.m_data;
  local_38 = baseData.m_size;
  local_48.m_data = (storage_type *)&local_58;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaa;
  uVar3 = ns.data1;
  local_58 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    ) |
             (ulong)(ushort)(ns.data2 << 8 | ns.data2 >> 8) << 0x20 |
             (ulong)(ushort)(ns.data3 << 8 | ns.data3 >> 8) << 0x30;
  local_48.m_size = 0x10;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_size = 2;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_data = &local_48;
  buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size = 0x14;
  buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data = (byte *)&local_28;
  QVar6 = QCryptographicHash::hashInto(buffer,data,algorithm);
  uVar1 = *(undefined8 *)QVar6.m_data;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    uVar3 = (uint)uVar1;
    uVar4 = (ushort)((ulong)uVar1 >> 0x20);
    uVar2 = (ushort)((ulong)uVar1 >> 0x30);
    uVar5 = (ulong)(version << 0xc | (uint)(ushort)((uVar2 & 0xff0f) << 8 | uVar2 >> 8)) << 0x30 |
            (ulong)CONCAT24(uVar4 << 8 | uVar4 >> 8,
                            uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                            uVar3 << 0x18);
    QVar7.data4 = (uchar  [8])(*(ulong *)(QVar6.m_data + 8) & 0xffffffffffffff3f | 0x80);
    QVar7.data1 = (int)uVar5;
    QVar7.data2 = (short)(uVar5 >> 0x20);
    QVar7.data3 = (short)(uVar5 >> 0x30);
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

static QUuid createFromName(QUuid ns, QByteArrayView baseData, QCryptographicHash::Algorithm algorithm, int version) noexcept
{
    std::byte buffer[20];
    Q_ASSERT(sizeof buffer >= size_t(QCryptographicHash::hashLength(algorithm)));
    QByteArrayView hashResult
        = QCryptographicHash::hashInto(buffer, {QByteArrayView{ns.toBytes()}, baseData}, algorithm);
    Q_ASSERT(hashResult.size() >= 16);
    hashResult.truncate(16); // Sha1 will be too long

    QUuid result = QUuid::fromRfc4122(hashResult);

    result.data3 &= 0x0FFF;
    result.data3 |= (version << 12);
    result.data4[0] &= 0x3F;
    result.data4[0] |= 0x80;

    return result;
}